

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

void __thiscall Mat::Resize(Mat *this,int newn,int newm)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  double *local_90;
  int local_64;
  int local_60;
  int j;
  int i_1;
  undefined1 local_30 [4];
  int nEl;
  Mat ytemp;
  int nel;
  int i;
  int newm_local;
  int newn_local;
  Mat *this_local;
  
  Mat((Mat *)local_30,this);
  if ((newn != this->n_cols_) || (newm != this->n_rows_)) {
    if ((this->v_ != (double *)0x0) && (this->v_ != (double *)0x0)) {
      operator_delete__(this->v_);
    }
    this->n_rows_ = newn;
    this->n_cols_ = newm;
    if (this->n_rows_ * this->n_cols_ < 1) {
      local_90 = (double *)0x0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(this->n_rows_ * this->n_cols_);
      uVar2 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      local_90 = (double *)operator_new__(uVar2);
    }
    this->v_ = local_90;
    for (local_60 = 0; piVar3 = std::min<int>(&this->n_rows_,(int *)local_30), local_60 < *piVar3;
        local_60 = local_60 + 1) {
      for (local_64 = 0; piVar3 = std::min<int>(&this->n_cols_,&nEl), local_64 < *piVar3;
          local_64 = local_64 + 1) {
        this->v_[local_60 * this->n_cols_ + local_64] =
             *(double *)(ytemp._0_8_ + (long)(local_60 * nEl + local_64) * 8);
      }
    }
  }
  ~Mat((Mat *)local_30);
  return;
}

Assistant:

void Mat::Resize(int newn, int newm)
{
	int i,nel;
	Mat ytemp = (*this);

	if (newn != n_cols_ || newm != n_rows_) {
		if (v_ != NULL) 
			delete[] (v_);		
		n_rows_ = newn;
		n_cols_ = newm;
		int nEl = n_rows_*n_cols_;
		v_ = n_rows_*n_cols_>0 ? new double[nEl] : NULL;		
		for (int i = 0; i < min(n_rows_,ytemp.n_rows_) ; i++)
			for (int j = 0; j < min(n_cols_,ytemp.n_cols_) ; j++)
				v_[i*n_cols_+j] = ytemp.v_[i*ytemp.n_cols_+j];
	}
}